

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

apx_error_t
apx_server_add_extension
          (apx_server_t *self,char *name,apx_serverExtensionHandler_t *handler,dtl_dv_t *config)

{
  apx_serverExtension_t *pItem;
  apx_serverExtension_t *extension;
  dtl_dv_t *config_local;
  apx_serverExtensionHandler_t *handler_local;
  char *name_local;
  apx_server_t *self_local;
  
  if ((self == (apx_server_t *)0x0) || (handler == (apx_serverExtensionHandler_t *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    pItem = apx_serverExtension_new(name,handler,config);
    if (pItem == (apx_serverExtension_t *)0x0) {
      self_local._4_4_ = 2;
    }
    else {
      adt_list_insert(&self->extension_manager,pItem);
      if (config != (dtl_dv_t *)0x0) {
        dtl_dv_inc_ref(config);
      }
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_server_add_extension(apx_server_t* self, const char* name, apx_serverExtensionHandler_t* handler, dtl_dv_t* config)
{
   if ( (self != NULL) && (handler != 0) )
   {
      apx_serverExtension_t *extension = apx_serverExtension_new(name, handler, config);
      if (extension == 0)
      {
         return APX_MEM_ERROR;
      }
      adt_list_insert(&self->extension_manager, (void*) extension);
      if (config != 0)
      {
         dtl_dv_inc_ref(config);
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}